

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberUtilities.cpp
# Opt level: O1

double Js::NumberUtilities::DblFromBinary<unsigned_char>
                 (uchar *psz,uchar **ppchLim,bool isNumericSeparatorEnabled)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  byte *pbVar4;
  ulong uVar5;
  byte bVar6;
  uint uVar7;
  byte *pbVar8;
  ulong uVar9;
  double dVar10;
  uint uVar11;
  uint uVar12;
  
  pbVar8 = psz;
  while( true ) {
    do {
      pbVar4 = pbVar8;
      bVar6 = *pbVar4;
      pbVar8 = pbVar4 + 1;
    } while (bVar6 == 0x30);
    if ((bVar6 & 0xfe) == 0x30) break;
    if ((((pbVar4 <= psz) || (bVar6 != 0x5f)) || (!isNumericSeparatorEnabled)) ||
       ((pbVar4[-1] != 0x30 || ((pbVar4[1] & 0xfe) != 0x30)))) {
      *ppchLim = pbVar4;
      return 0.0;
    }
  }
  uVar11 = 1;
  uVar5 = 0;
  bVar6 = 0;
  do {
    while( true ) {
      pbVar8 = pbVar4 + 1;
      bVar2 = *pbVar8;
      uVar12 = bVar2 - 0x30;
      uVar3 = (uint)uVar5;
      uVar7 = (uint)(uVar5 >> 0x20);
      if (uVar12 < 2) break;
      if ((((bVar2 != 0x5f) || (!isNumericSeparatorEnabled)) || ((int)uVar11 < 1)) ||
         ((*pbVar4 == 0x5f || (pbVar1 = pbVar4 + 2, pbVar4 = pbVar8, (*pbVar1 & 0xfe) != 0x30)))) {
        *ppchLim = pbVar8;
        if (0x7fe < (int)(uVar11 + 0x3fe)) {
          return INFINITY;
        }
        uVar7 = uVar7 | (uVar11 + 0x3fe) * 0x100000;
        dVar10 = (double)(uVar5 & 0xffffffff | (ulong)uVar7 << 0x20);
        if (-1 < (char)bVar6) {
          return dVar10;
        }
        if (((bVar6 & 0x7f) == 0) && ((uVar5 & 1) == 0)) {
          return dVar10;
        }
        if (uVar3 == 0xffffffff) {
          return (double)((ulong)(uVar7 + 1) << 0x20);
        }
        return (double)CONCAT44(uVar7,uVar3 + 1);
      }
    }
    if (uVar11 < 0x15) {
      uVar9 = (ulong)(uVar7 | uVar12 << (0x14U - (char)uVar11 & 0x1f)) << 0x20;
      uVar5 = uVar5 & 0xffffffff;
LAB_0068b4b5:
      uVar5 = uVar5 | uVar9;
    }
    else {
      if (uVar11 < 0x35) {
        uVar9 = (ulong)(uVar3 | uVar12 << (0x34U - (char)uVar11 & 0x1f));
        uVar5 = uVar5 & 0xffffffff00000000;
        goto LAB_0068b4b5;
      }
      if (uVar11 == 0x35) {
        bVar6 = bVar2 << 7;
      }
      else {
        bVar6 = bVar6 | (byte)uVar12;
      }
    }
    uVar11 = uVar11 + 1;
    pbVar4 = pbVar8;
  } while( true );
}

Assistant:

double NumberUtilities::DblFromBinary(const EncodedChar *psz, const EncodedChar **ppchLim, bool isNumericSeparatorEnabled)
    {
        double dbl = 0;
        Assert(Js::NumberUtilities::LuHiDbl(dbl) == 0);
        Assert(Js::NumberUtilities::LuLoDbl(dbl) == 0);
        uint uT;
        byte bExtra = 0;
        int cbit = 0;
        const EncodedChar* pszSave = psz;

        // Skip leading zeros.
LSkipZeroes:
        while (*psz == '0')
            psz++;

        // Get the first digit.
        uT = *psz - '0';
        if (uT > 1)
        {
            // We can skip over this numeric separator character if:
            //  - numeric separators are enabled
            //  - we've walked past at least one zero character (ie: this isn't the first character in psz)
            //  - the previous character was a zero
            //  - the following character is a valid binary digit
            if (*psz == '_' && isNumericSeparatorEnabled && pszSave < psz && psz[-1] == '0' && static_cast<uint>(psz[1] - '0') <= 1)
            {
                psz++;
                goto LSkipZeroes;
            }

            *ppchLim = psz;
            return dbl;
        }

        //Now that leading zeros are skipped first bit should be one so lets
        //go ahead and count it and increment psz
        cbit = 1;
        psz++;

        // According to the existing implementations these numbers
        // should n bits away from 21 and 53. The n bits are determined by the
        // numerical type. for example since 4 bits are necessary to represent a
        // hexadecimal number and 3 bits to represent an octal you will see that
        // the hex case is represented by 21-4 = 17 and the octal case is represented
        // by 21-3 = 18, thus for binary where 1 bit is need to represent 2 numbers 21-1 = 20
        const uint rightShiftValue = 20;
        // Why 52? 52 is the last explicit bit and 1 bit away from 53 (max bits of precision
        // for double precision floating point)
        const uint leftShiftValue = 52;

LGetBinaryDigit:
        uT = *psz - '0';
        if (uT <= 1)
        {
            if (cbit <= rightShiftValue)
            {
                Js::NumberUtilities::LuHiDbl(dbl) |= (uint32)uT << (rightShiftValue - cbit);
            }
            else if (cbit <= leftShiftValue)
            {
                Js::NumberUtilities::LuLoDbl(dbl) |= (uint32)uT << (leftShiftValue - cbit);
            }
            else if (cbit == leftShiftValue + 1)//53 bits
            {
                Js::NumberUtilities::LuLoDbl(dbl) |= (uint32)uT >> (cbit - leftShiftValue);
                bExtra = (byte)(uT << (60 - cbit));
            }
            else if (0 != uT)
            {
                bExtra |= 1;
            }
            cbit++;
            psz++;
            goto LGetBinaryDigit;
        }
        else if (*psz == '_')
        {
            if (isNumericSeparatorEnabled && cbit > 0 && psz[-1] != '_' && static_cast<uint>(psz[1] - '0') <= 1)
            {
                psz++;
                goto LGetBinaryDigit;
            }
        }
        // Set the lim.
        *ppchLim = psz;

        // Set the exponent.
        cbit += 1022;
        if (cbit > 2046)
        {
            // Overflow to Infinity
            Js::NumberUtilities::LuHiDbl(dbl) = 0x7FF00000;
            Js::NumberUtilities::LuLoDbl(dbl) = 0;
            return dbl;
        }

        Js::NumberUtilities::LuHiDbl(dbl) |= (uint32)cbit << 20;

        // Use bExtra to round.
        if ((bExtra & 0x80) && ((bExtra & 0x7F) || (Js::NumberUtilities::LuLoDbl(dbl) & 1)))
        {
            // Round up. Note that this overflows the mantissa correctly,
            // even to Infinity.
            if (0 == ++Js::NumberUtilities::LuLoDbl(dbl))
                ++Js::NumberUtilities::LuHiDbl(dbl);
        }
        return dbl;
    }